

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O3

bool ImportKey(FileTest *t,KeyMap *key_map,_func_EVP_PKEY_ptr_CBS_ptr *parse_func,
              _func_int_CBB_ptr_EVP_PKEY_ptr *marshal_func)

{
  _Head_base<0UL,_evp_pkey_st_*,_false> __p;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  string *__k;
  const_iterator cVar4;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *this;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  size_t __n;
  ulong uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  size_t len;
  UniquePtr<EVP_PKEY> pkey;
  size_t len_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  ScopedCBB cbb;
  string key_type;
  UniquePtr<uint8_t> free_der;
  uint8_t *der;
  size_t der_len;
  CBS cbs;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_110;
  Bytes local_108;
  size_type local_f8;
  AssertHelper local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 local_a8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_98;
  string local_78;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  AssertHelperData *local_50;
  pointer local_48;
  CBS local_40;
  
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._0_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Input","");
  bVar1 = FileTest::GetBytes(t,&local_c8,(string *)local_a8);
  if ((anon_union_32_2_4f6aaa2e_for_u *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98.base.buf + 1));
  }
  if (!bVar1) {
    bVar1 = false;
    goto LAB_002899d0;
  }
  local_40.len = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  local_40.data =
       local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_110._M_head_impl = (*parse_func)(&local_40);
  if ((EVP_PKEY *)local_110._M_head_impl == (EVP_PKEY *)0x0) {
    bVar1 = false;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_a8._0_8_ = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Type","");
    bVar1 = FileTest::GetAttribute(t,&local_78,(string *)local_a8);
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98.base.buf + 1));
    }
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar2 == 0) {
        uVar3 = 6;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar2 == 0) {
          uVar3 = 0x198;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar2 == 0) {
            uVar3 = 0x74;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar2 == 0) {
              uVar3 = 0x3b5;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_78);
              if (iVar2 == 0) {
                uVar3 = 0x3b4;
              }
              else {
                testing::Message::Message((Message *)local_178);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_178 + 0x10),"Unknown key type: ",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_178 + 0x10),local_78._M_dataplus._M_p,
                           local_78._M_string_length);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_158,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                           ,0x52,"Failed");
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_158,(Message *)local_178);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
                if (local_178 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_178 + 8))();
                }
                uVar3 = 0;
              }
            }
          }
        }
      }
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
      local_178._0_4_ = EVP_PKEY_id((EVP_PKEY *)local_110._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a8,"GetKeyType(t, key_type)","EVP_PKEY_id(pkey.get())",
                 (int *)&local_e8,(int *)local_178);
      if (local_a8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_178);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_a8._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_178);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
        if (local_178 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_178 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._8_8_);
      }
      CBB_zero((CBB *)local_a8);
      iVar2 = CBB_init((CBB *)local_a8,0);
      if (iVar2 == 0) {
LAB_00288e1c:
        bVar1 = false;
      }
      else {
        iVar2 = (*marshal_func)((CBB *)local_a8,local_110._M_head_impl);
        if (iVar2 == 0) goto LAB_00288e1c;
        iVar2 = CBB_finish((CBB *)local_a8,(uint8_t **)&local_50,(size_t *)&local_48);
        if (iVar2 == 0) goto LAB_00288e1c;
        local_58._M_head_impl = (uchar *)local_50;
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar6 = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (uVar6 == 0) {
          __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar6 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(uVar6);
          __n = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        }
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(uVar6 + (long)__dest);
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)__dest;
        if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)__dest;
          memmove(__dest,local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,__n);
        }
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(__dest->_M_local_buf + __n);
        local_178 = (undefined1  [8])&local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Output","");
        bVar1 = FileTest::HasAttribute(t,(string *)local_178);
        if (bVar1) {
          local_158 = (undefined1  [8])&local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Output","");
          bVar1 = FileTest::GetBytes(t,&local_e8,(string *)local_158);
          if (local_158 != (undefined1  [8])&local_148) {
            operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
          }
          bVar1 = !bVar1;
        }
        else {
          bVar1 = false;
        }
        if (local_178 != (undefined1  [8])&local_168) {
          operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
        }
        if (bVar1) {
LAB_00288f00:
          bVar1 = false;
        }
        else {
          pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish +
                        -(long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          local_158 = (undefined1  [8])
                      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_50;
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = local_48;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_178,"Bytes(output)","Bytes(der, der_len)",(Bytes *)local_158,
                     (Bytes *)&local_138);
          if (local_178[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_158);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_158 + 0x10),"Re-encoding the key did not match.",0x22
                      );
            if (local_170 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_170->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_138,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x92,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_138,(Message *)local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
            if (local_158 != (undefined1  [8])0x0) {
              (**(code **)(*(size_type *)local_158 + 8))();
            }
          }
          if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_170,local_170);
          }
          local_178 = (undefined1  [8])&local_168;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,"ExpectNoRawPrivate","");
          bVar1 = FileTest::HasAttribute(t,(string *)local_178);
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
          }
          if (!bVar1) {
            local_178 = (undefined1  [8])&local_168;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,"ExpectRawPrivate","");
            bVar1 = FileTest::HasAttribute(t,(string *)local_178);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
            if (!bVar1) goto LAB_00289401;
            local_158 = (undefined1  [8])0x0;
            pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_148._M_allocated_capacity = 0;
            local_178 = (undefined1  [8])&local_168;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,"ExpectRawPrivate","");
            bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_158,(string *)local_178);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
            if (bVar1) {
              local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              iVar2 = EVP_PKEY_get_raw_private_key(local_110._M_head_impl,(uint8_t *)0x0,&local_f8);
              if (iVar2 != 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_138,local_f8);
                iVar2 = EVP_PKEY_get_raw_private_key
                                  (local_110._M_head_impl,
                                   local_138.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,&local_f8);
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_138,local_f8);
                  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)local_138.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_138.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  local_120 = (undefined1  [8])
                              local_138.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  local_108.span_.size_ = (long)pbStack_150 - (long)local_158;
                  local_108.span_.data_ = (uchar *)local_158;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_178,"Bytes(raw)","Bytes(expected)",(Bytes *)local_120
                             ,&local_108);
                  if (local_178[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_120);
                    if (local_170 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = (local_170->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_108,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xa8,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_108,(Message *)local_120);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
                    if (local_120 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_120 + 8))();
                    }
                  }
                  if (local_170 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_170,local_170);
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_138,local_f8 - 1);
                  local_f8 = (long)local_138.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_138.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                  iVar2 = EVP_PKEY_get_raw_private_key
                                    (local_110._M_head_impl,
                                     local_138.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_f8);
                  local_120[0] = iVar2 == 0;
                  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_108);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_178,(internal *)local_120,
                               (AssertionResult *)
                               "EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)","true",
                               "false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_f0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xad,(char *)local_178);
                    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
                    testing::internal::AssertHelper::~AssertHelper(&local_f0);
                    if (local_178 != (undefined1  [8])&local_168) {
                      operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108.span_.data_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      (**(code **)(*(size_type *)local_108.span_.data_ + 8))();
                    }
                    if (local_118 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(local_120 + 8),local_118);
                    }
                  }
                  if ((AssertHelperData *)
                      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
                    operator_delete(local_138.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_138.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_138.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_158 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_158,
                                    local_148._M_allocated_capacity - (long)local_158);
                  }
                  goto LAB_00289401;
                }
              }
              goto LAB_0028968e;
            }
LAB_002896a5:
            if (local_158 != (undefined1  [8])0x0) {
              operator_delete((void *)local_158,local_148._M_allocated_capacity - (long)local_158);
            }
            goto LAB_00288f00;
          }
          iVar2 = EVP_PKEY_get_raw_private_key
                            (local_110._M_head_impl,(uint8_t *)0x0,(size_t *)&local_138);
          local_158[0] = iVar2 == 0;
          pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)local_120);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_178,(internal *)local_158,
                       (AssertionResult *)"EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x97,(char *)local_178);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_108,(Message *)local_120);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
            if (local_120 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_120 + 8))();
            }
            if (pbStack_150 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_150,pbStack_150);
            }
          }
LAB_00289401:
          local_178 = (undefined1  [8])&local_168;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,"ExpectNoRawPublic","");
          bVar1 = FileTest::HasAttribute(t,(string *)local_178);
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
          }
          if (bVar1) {
            iVar2 = EVP_PKEY_get_raw_public_key
                              (local_110._M_head_impl,(uint8_t *)0x0,(size_t *)&local_138);
            local_158[0] = iVar2 == 0;
            pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 != 0) {
              testing::Message::Message((Message *)local_120);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_178,(internal *)local_158,
                         (AssertionResult *)"EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0xb2,(char *)local_178);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_120);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if (local_178 != (undefined1  [8])&local_168) {
                operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
              }
              if (local_120 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_120 + 8))();
              }
              if (pbStack_150 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&pbStack_150,pbStack_150);
              }
            }
          }
          else {
            local_178 = (undefined1  [8])&local_168;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,"ExpectRawPublic","");
            bVar1 = FileTest::HasAttribute(t,(string *)local_178);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
            if (bVar1) {
              local_158 = (undefined1  [8])0x0;
              pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_148._M_allocated_capacity = 0;
              local_178 = (undefined1  [8])&local_168;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_178,"ExpectRawPublic","");
              bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_158,(string *)local_178);
              if (local_178 != (undefined1  [8])&local_168) {
                operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
              }
              if (bVar1) {
                local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                iVar2 = EVP_PKEY_get_raw_public_key(local_110._M_head_impl,(uint8_t *)0x0,&local_f8)
                ;
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_138,local_f8);
                  iVar2 = EVP_PKEY_get_raw_public_key
                                    (local_110._M_head_impl,
                                     local_138.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_f8);
                  if (iVar2 != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_138,local_f8);
                    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)local_138.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    local_120 = (undefined1  [8])
                                local_138.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    local_108.span_.size_ = (long)pbStack_150 - (long)local_158;
                    local_108.span_.data_ = (uchar *)local_158;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_178,"Bytes(raw)","Bytes(expected)",
                               (Bytes *)local_120,&local_108);
                    if (local_178[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_120);
                      if (local_170 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = (local_170->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_108,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xc3,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_108,(Message *)local_120);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
                      if (local_120 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_120 + 8))();
                      }
                    }
                    if (local_170 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_170,local_170);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_138,local_f8 - 1);
                    local_f8 = (long)local_138.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                    iVar2 = EVP_PKEY_get_raw_public_key
                                      (local_110._M_head_impl,
                                       local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&local_f8);
                    local_120[0] = iVar2 == 0;
                    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if (iVar2 != 0) {
                      testing::Message::Message((Message *)&local_108);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_178,(internal *)local_120,
                                 (AssertionResult *)
                                 "EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)","true",
                                 "false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_f0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,200,(char *)local_178);
                      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                      if (local_178 != (undefined1  [8])&local_168) {
                        operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108.span_.data_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        (**(code **)(*(size_type *)local_108.span_.data_ + 8))();
                      }
                      if (local_118 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_120 + 8),local_118);
                      }
                    }
                    if ((AssertHelperData *)
                        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
                      operator_delete(local_138.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_138.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_138.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_158 != (undefined1  [8])0x0) {
                      operator_delete((void *)local_158,
                                      local_148._M_allocated_capacity - (long)local_158);
                    }
                    goto LAB_00289849;
                  }
                }
LAB_0028968e:
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  operator_delete(local_138.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_138.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_138.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              goto LAB_002896a5;
            }
          }
LAB_00289849:
          __k = FileTest::GetParameter_abi_cxx11_(t);
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_138.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                  ::find(&key_map->_M_t,__k);
          local_158 = (undefined1  [8])
                      (ulong)((_Rb_tree_header *)cVar4._M_node !=
                             &(key_map->_M_t)._M_impl.super__Rb_tree_header);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_178,"0u","key_map->count(key_name)",(uint *)&local_138,
                     (unsigned_long *)local_158);
          if (local_178[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_158);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_158 + 0x10),"Duplicate key: ",0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_158 + 0x10),(__k->_M_dataplus)._M_p,
                       __k->_M_string_length);
            if (local_170 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_170->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_138,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0xcd,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_138,(Message *)local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
            if (local_158 != (undefined1  [8])0x0) {
              (**(code **)(*(size_type *)local_158 + 8))();
            }
          }
          if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_170,local_170);
          }
          this = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                 ::operator[](key_map,__k);
          __p._M_head_impl = local_110._M_head_impl;
          local_110._M_head_impl = (evp_pkey_st *)0x0;
          std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset(this,__p._M_head_impl);
          bVar1 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_58);
      }
      CBB_cleanup((CBB *)local_a8);
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_110);
LAB_002899d0:
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

static bool ImportKey(FileTest *t, KeyMap *key_map,
                      EVP_PKEY *(*parse_func)(CBS *cbs),
                      int (*marshal_func)(CBB *cbb, const EVP_PKEY *key)) {
  std::vector<uint8_t> input;
  if (!t->GetBytes(&input, "Input")) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, input.data(), input.size());
  bssl::UniquePtr<EVP_PKEY> pkey(parse_func(&cbs));
  if (!pkey) {
    return false;
  }

  std::string key_type;
  if (!t->GetAttribute(&key_type, "Type")) {
    return false;
  }
  EXPECT_EQ(GetKeyType(t, key_type), EVP_PKEY_id(pkey.get()));

  // The key must re-encode correctly.
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !marshal_func(cbb.get(), pkey.get()) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_der(der);

  std::vector<uint8_t> output = input;
  if (t->HasAttribute("Output") &&
      !t->GetBytes(&output, "Output")) {
    return false;
  }
  EXPECT_EQ(Bytes(output), Bytes(der, der_len))
      << "Re-encoding the key did not match.";

  if (t->HasAttribute("ExpectNoRawPrivate")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPrivate")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPrivate")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len));
  }

  if (t->HasAttribute("ExpectNoRawPublic")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPublic")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPublic")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len));
  }

  // Save the key for future tests.
  const std::string &key_name = t->GetParameter();
  EXPECT_EQ(0u, key_map->count(key_name)) << "Duplicate key: " << key_name;
  (*key_map)[key_name] = std::move(pkey);
  return true;
}